

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::GenericSoundEssenceDescriptor::GenericSoundEssenceDescriptor
          (GenericSoundEssenceDescriptor *this,GenericSoundEssenceDescriptor *rhs)

{
  byte_t *value;
  UL local_48;
  GenericSoundEssenceDescriptor *local_18;
  GenericSoundEssenceDescriptor *rhs_local;
  GenericSoundEssenceDescriptor *this_local;
  
  local_18 = rhs;
  rhs_local = this;
  FileDescriptor::FileDescriptor
            (&this->super_FileDescriptor,
             (rhs->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.m_Dict);
  (this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
  _vptr_KLVPacket = (_func_int **)&PTR__GenericSoundEssenceDescriptor_0033a6b0;
  Rational::Rational(&this->AudioSamplingRate);
  optional_property<unsigned_char>::optional_property(&this->AudioRefLevel);
  optional_property<unsigned_char>::optional_property(&this->ElectroSpatialFormulation);
  optional_property<unsigned_char>::optional_property(&this->DialNorm);
  UL::UL(&this->SoundEssenceCoding);
  optional_property<unsigned_char>::optional_property(&this->ReferenceAudioAlignmentLevel);
  optional_property<ASDCP::MXF::Rational>::optional_property(&this->ReferenceImageEditRate);
  if ((this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.m_Dict !=
      (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_FileDescriptor).super_GenericDescriptor.
                           super_InterchangeObject.m_Dict,MDD_GenericSoundEssenceDescriptor);
    UL::UL(&local_48,value);
    UL::operator=(&(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.
                   super_KLVPacket.m_UL,&local_48);
    UL::~UL(&local_48);
    (*(this->super_FileDescriptor).super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
      _vptr_KLVPacket[0x15])(this,local_18);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x5cf,
                "ASDCP::MXF::GenericSoundEssenceDescriptor::GenericSoundEssenceDescriptor(const GenericSoundEssenceDescriptor &)"
               );
}

Assistant:

GenericSoundEssenceDescriptor::GenericSoundEssenceDescriptor(const GenericSoundEssenceDescriptor& rhs) : FileDescriptor(rhs.m_Dict)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_GenericSoundEssenceDescriptor);
  Copy(rhs);
}